

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malicious_aligned_heap_vectorization.cpp
# Opt level: O3

ostream * operator<<(ostream *o,Vector4d *v)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
  poVar1 = std::ostream::_M_insert<double>(v->data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(v->data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(v->data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(v->data[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return o;
}

Assistant:

std::ostream& operator<< (std::ostream& o, const Vector4d& v) {
  o << "(" << v.data[0] << ", " << v.data[1] << ", " << v.data[2] << ", " << v.data[3] << ")";
  return o;
}